

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_add_substitution
              (cram_fd *fd,cram_container *c,cram_slice *s,cram_record *r,int pos,char base,
              char qual,char ref)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  double local_48;
  undefined1 local_40 [8];
  cram_feature f;
  char base_local;
  int pos_local;
  cram_record *r_local;
  cram_slice *s_local;
  cram_container *c_local;
  cram_fd *fd_local;
  
  f.field_0.X.base._3_1_ = base;
  f.field_0.B.qual = pos;
  if ((fd->L2[(byte)base] < 4) || ((fd->L2[(byte)base] < 5 && (fd->L2[(byte)ref] < 4)))) {
    local_40._0_4_ = pos + 1;
    local_40._4_4_ = 0x58;
    f.field_0.X.pos = (int)fd->cram_sub_matrix[(int)((int)ref & 0x1f)][(int)((int)base & 0x1f)];
    cram_stats_add(c->stats[0x1f],f.field_0.X.pos);
  }
  else {
    local_40._0_4_ = pos + 1;
    local_40._4_4_ = 0x42;
    f.field_0.X.pos = (int)base;
    f.field_0.X.code = (int)qual;
    cram_stats_add(c->stats[0x1e],f.field_0.X.pos);
    cram_stats_add(c->stats[0xc],f.field_0.X.code);
    while (s->qual_blk->alloc <= s->qual_blk->byte + 1) {
      if (s->qual_blk->alloc == 0) {
        local_48 = 1024.0;
      }
      else {
        sVar1 = s->qual_blk->alloc;
        auVar4._8_4_ = (int)(sVar1 >> 0x20);
        auVar4._0_8_ = sVar1;
        auVar4._12_4_ = 0x45300000;
        local_48 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      s->qual_blk->alloc =
           (long)local_48 | (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f;
      puVar3 = (uchar *)realloc(s->qual_blk->data,s->qual_blk->alloc);
      s->qual_blk->data = puVar3;
    }
    puVar3 = s->qual_blk->data;
    sVar1 = s->qual_blk->byte;
    s->qual_blk->byte = sVar1 + 1;
    puVar3[sVar1] = qual;
  }
  iVar2 = cram_add_feature(c,s,r,(cram_feature *)local_40);
  return iVar2;
}

Assistant:

static int cram_add_substitution(cram_fd *fd, cram_container *c,
				 cram_slice *s, cram_record *r,
				 int pos, char base, char qual, char ref) {
    cram_feature f;

    // seq=ACGTN vs ref=ACGT or seq=ACGT vs ref=ACGTN
    if (fd->L2[(uc)base]<4 || (fd->L2[(uc)base]<5 && fd->L2[(uc)ref]<4)) {
	f.X.pos = pos+1;
	f.X.code = 'X';
	f.X.base = fd->cram_sub_matrix[ref&0x1f][base&0x1f];
	cram_stats_add(c->stats[DS_BS], f.X.base);
    } else {
	f.B.pos = pos+1;
	f.B.code = 'B';
	f.B.base = base;
	f.B.qual = qual;
	cram_stats_add(c->stats[DS_BA], f.B.base);
	cram_stats_add(c->stats[DS_QS], f.B.qual);
	BLOCK_APPEND_CHAR(s->qual_blk, qual);
    }
    return cram_add_feature(c, s, r, &f);
}